

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topten.c
# Opt level: O3

void update_topten(int how,char *dumpname)

{
  char cVar1;
  boolean bVar2;
  int iVar3;
  int iVar4;
  FILE *__stream;
  char *pcVar5;
  long lVar6;
  unsigned_long uVar7;
  toptenentry *__ptr;
  char *pcVar8;
  ulong uVar9;
  uint uVar10;
  int *piVar11;
  char cVar12;
  ulong uVar13;
  toptenentry *__dest;
  char local_158 [104];
  toptenentry newtt;
  
  if (program_state.panicking != 0) {
    return;
  }
  end_how = how;
  fill_topten_entry(&newtt,how);
  iVar3 = open_datafile("logfile",0x441,2);
  bVar2 = lock_fd(iVar3,10);
  if (bVar2 != '\0') {
    writeentry(iVar3,&newtt);
    unlock_fd(iVar3);
    close(iVar3);
  }
  iVar3 = open_datafile("xlogfile",0x441,2);
  bVar2 = lock_fd(iVar3,10);
  if (bVar2 != '\0') {
    __stream = fdopen(iVar3,"a");
    fprintf(__stream,
            "version=%d.%d.%d:points=%d:deathdnum=%d:deathlev=%d:maxlvl=%d:hp=%d:maxhp=%d:deaths=%d:deathdate=%lu:birthdate=%lu:uid=%d"
            ,(ulong)(uint)newtt.ver_major,(ulong)(uint)newtt.ver_minor,(ulong)(uint)newtt.patchlevel
            ,(ulong)(uint)newtt.points,(ulong)(uint)newtt.deathdnum,(ulong)(uint)newtt.deathlev,
            (ulong)(uint)newtt.maxlvl,(ulong)(uint)newtt.hp,(ulong)(uint)newtt.maxhp,
            (ulong)(uint)newtt.deaths,(long)newtt.deathdate,(long)newtt.birthdate,
            (ulong)(uint)newtt.uid);
    fprintf(__stream,":role=%s:race=%s:gender=%s:align=%s",newtt.plrole,newtt.plrace,newtt.plgend,
            newtt.plalign);
    pcVar5 = nh_getenv("DYNAMOHACKUSER");
    if (pcVar5 == (char *)0x0) {
      pcVar5 = nh_getenv("USER");
    }
    pcVar8 = "";
    if (pcVar5 != (char *)0x0) {
      pcVar8 = pcVar5;
    }
    lVar6 = 0;
    do {
      cVar1 = pcVar8[lVar6];
      cVar12 = '_';
      if (((cVar1 != '\n') && (cVar1 != ':')) && (cVar12 = cVar1, cVar1 == '\0')) goto LAB_00260528;
      local_158[lVar6] = cVar12;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 99);
    lVar6 = 99;
LAB_00260528:
    local_158[lVar6] = '\0';
    lVar6 = 0;
    fprintf(__stream,":name=%s",local_158);
    do {
      cVar1 = plname[lVar6];
      cVar12 = '_';
      if (((cVar1 != '\n') && (cVar1 != ':')) && (cVar12 = cVar1, cVar1 == '\0')) goto LAB_00260578;
      local_158[lVar6] = cVar12;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 99);
    lVar6 = 99;
LAB_00260578:
    local_158[lVar6] = '\0';
    lVar6 = 0;
    fprintf(__stream,":charname=%s",local_158);
    do {
      cVar1 = newtt.death[lVar6];
      cVar12 = '_';
      if (((cVar1 != '\n') && (cVar1 != ':')) && (cVar12 = cVar1, cVar1 == '\0')) goto LAB_002605c6;
      local_158[lVar6] = cVar12;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 99);
    lVar6 = 99;
LAB_002605c6:
    local_158[lVar6] = '\0';
    lVar6 = 0;
    fprintf(__stream,":death=%s",local_158);
    uVar7 = encode_conduct();
    fprintf(__stream,":conduct=%ld",uVar7);
    fprintf(__stream,":turns=%u",(ulong)moves);
    uVar10 = (uint)((ushort)u.uevent._0_2_ >> 2);
    uVar9 = (ulong)((uint)((u.uevent._0_2_ & 3) != 0) | uVar10 & 2);
    uVar13 = uVar9 + 4;
    if ((quest_status._0_4_ & 0x80040) == 0) {
      uVar13 = uVar9;
    }
    uVar13 = ((ushort)u.uevent._0_2_ >> 6 & 0x100 |
             uVar10 & 0x80 |
             (ushort)u.uevent._0_2_ >> 7 & 0x40 |
             (ushort)u.uevent._0_2_ >> 5 & 0x20 | (ushort)u.uevent._0_2_ >> 4 & 0x10 | uVar10 & 8) |
             uVar13;
    uVar9 = uVar13 | 0x200;
    if ((u.uevent._0_2_ & 0x1800) == 0) {
      uVar9 = uVar13;
    }
    uVar9 = (uint)quest_status._0_4_ >> 4 & 0x400 | uVar9;
    uVar13 = uVar9 | 0x800;
    if (mvitals[0x129].died == '\0') {
      uVar13 = uVar9;
    }
    uVar9 = uVar13 | 0x1000;
    if (mvitals[0x127].died == '\0') {
      uVar9 = uVar13;
    }
    uVar13 = uVar9 | 0x2000;
    if (mvitals[0xea].died == '\0') {
      uVar13 = uVar9;
    }
    uVar9 = uVar13 | 0x4000;
    if (mvitals[0x128].died == '\0') {
      uVar9 = uVar13;
    }
    uVar13 = uVar9 | 0x8000;
    if (mvitals[0x143].died == '\0') {
      uVar13 = uVar9;
    }
    fprintf(__stream,":event=%ld",uVar13);
    fprintf(__stream,":carried=%ld",(ulong)((byte)u.uhave._0_1_ & 0x1f));
    fprintf(__stream,":starttime=%lu:endtime=%lu",u.ubirthday,deathtime_internal);
    fprintf(__stream,":gender0=%s",genders[u.initgend].filecode);
    fprintf(__stream,":align0=%s",aligns[1 - (long)u.ualignbase[1]].filecode);
    fprintf(__stream,":xplevel=%d",(ulong)(uint)u.ulevel);
    fprintf(__stream,":exp=%d",(ulong)(uint)u.uexp);
    pcVar5 = "explore";
    if (flags.explore == '\0') {
      pcVar5 = "normal";
    }
    pcVar8 = "debug";
    if (flags.debug == '\0') {
      pcVar8 = pcVar5;
    }
    fprintf(__stream,":mode=%s",pcVar8);
    do {
      cVar1 = dumpname[lVar6];
      cVar12 = '_';
      if (((cVar1 != '\n') && (cVar1 != ':')) && (cVar12 = cVar1, cVar1 == '\0')) goto LAB_0026086d;
      local_158[lVar6] = cVar12;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 99);
    lVar6 = 99;
LAB_0026086d:
    local_158[lVar6] = '\0';
    fprintf(__stream,":dumplog=%s",dumpname);
    fputc(10,__stream);
    unlock_fd(iVar3);
    fclose(__stream);
  }
  if (flags.explore != '\0' || flags.debug != '\0') {
    return;
  }
  iVar3 = open_datafile("record",0x42,2);
  bVar2 = lock_fd(iVar3,0x1e);
  if (bVar2 == '\0') {
    close(iVar3);
    return;
  }
  __ptr = read_topten(iVar3,10000);
  pcVar5 = __ptr->name;
  lVar6 = 0;
  uVar10 = 0;
  do {
    if (((((toptenentry *)(pcVar5 + -0x4c))->points < 1) && (*(int *)(pcVar5 + -0x44) == 0)) ||
       (((toptenentry *)(pcVar5 + -0x4c))->points < newtt.points)) {
      if (uVar10 < 1000) {
        uVar13 = -lVar6;
        if (0x270e < uVar13 && lVar6 != -9999) goto LAB_00260a02;
        piVar11 = (int *)(pcVar5 + -0x44);
        goto LAB_0026097b;
      }
      break;
    }
    iVar4 = strncmp(newtt.name,pcVar5,0xf);
    uVar10 = uVar10 + (iVar4 == 0);
    lVar6 = lVar6 + -1;
    pcVar5 = pcVar5 + 0xc0;
  } while (lVar6 != -10000);
  goto LAB_00260a61;
  while( true ) {
    iVar4 = strncmp(newtt.name,pcVar5,0xf);
    if (iVar4 == 0) {
      if (0x3e6 < (int)uVar10) goto LAB_002609cb;
      uVar10 = uVar10 + 1;
    }
    lVar6 = lVar6 + -1;
    piVar11 = piVar11 + 0x30;
    if (lVar6 == -10000) break;
LAB_0026097b:
    if ((((toptenentry *)(piVar11 + -2))->points < 1) && (*piVar11 == 0)) {
LAB_002609cb:
      iVar4 = -(int)lVar6;
      goto LAB_002609ce;
    }
  }
  iVar4 = 9999;
LAB_002609ce:
  if ((int)uVar13 < iVar4) {
    lVar6 = (long)iVar4;
    __dest = __ptr + lVar6;
    do {
      memcpy(__dest,__dest + -1,0xc0);
      lVar6 = lVar6 + -1;
      __dest = __dest + -1;
    } while ((long)uVar13 < lVar6);
  }
LAB_00260a02:
  memcpy((toptenentry *)(pcVar5 + -0x4c),&newtt,0xc0);
  lVar6 = 0;
  lseek(iVar3,0,0);
  ftruncate(iVar3,0);
  do {
    if ((*(int *)(__ptr->plrole + lVar6 + -0x3c) < 1) &&
       (*(int *)(__ptr->plrole + lVar6 + -0x34) == 0)) break;
    writeentry(iVar3,(toptenentry *)(__ptr->plrole + lVar6 + -0x3c));
    lVar6 = lVar6 + 0xc0;
  } while (lVar6 != 0x1d4c00);
LAB_00260a61:
  unlock_fd(iVar3);
  close(iVar3);
  free(__ptr);
  return;
}

Assistant:

void update_topten(int how, const char *dumpname)
{
    struct toptenentry *toptenlist, newtt;
    boolean need_rewrite;
    int  fd;

    if (program_state.panicking)
	return;

    end_how = how; /* save how for nh_get_topten */

    fill_topten_entry(&newtt, how);
    update_log(&newtt);
    update_xlog(&newtt, dumpname);

    /* nothing more to do for non-scoring games */
    if (wizard || discover)
	return;

    fd = open_datafile(RECORD, O_RDWR | O_CREAT, SCOREPREFIX);
    if (!lock_fd(fd, 30)) {
	close(fd);
	return;
    }

    toptenlist = read_topten(fd, TTLISTLEN);

    /* possibly rearrange the score list to include the new entry */
    need_rewrite = toptenlist_insert(toptenlist, &newtt);
    if (need_rewrite)
	write_topten(fd, toptenlist);

    unlock_fd(fd);
    close(fd);
    free(toptenlist);
}